

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O1

void __thiscall Sudoku::skryjNa30(Sudoku *this)

{
  uint *puVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  Sudoku temp;
  Sudoku local_1d4;
  
  memset(&local_1d4,0,0x1bc);
  do {
    memset(&local_1d4,0,0x1bc);
    iVar5 = 0;
    do {
      do {
        iVar3 = rand();
        iVar3 = iVar3 % 0x51;
        bVar2 = *(byte *)(local_1d4.s.pole + iVar3);
      } while ((bVar2 & 0xf) != 0);
      bVar4 = *(byte *)((this->s).pole + iVar3) & 0xf;
      *(byte *)(local_1d4.s.pole + iVar3) = bVar2 | bVar4 | 0x10;
      uVar6 = 1 << bVar4;
      puVar1 = local_1d4.s.radky + iVar3 / 9;
      *puVar1 = *puVar1 | uVar6;
      puVar1 = local_1d4.s.sloupce + iVar3 % 9;
      *puVar1 = *puVar1 | uVar6;
      puVar1 = local_1d4.s.ctverce[(iVar3 % 9) / 3] + iVar3 / 0x1b;
      *puVar1 = *puVar1 | uVar6;
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0x1e);
    local_1d4.s.doplnenych = 0x1e;
    do {
      iVar5 = krok(&local_1d4);
    } while (iVar5 != 0);
  } while (local_1d4.s.doplnenych != 0x51);
  memcpy(this,&local_1d4,0x1bc);
  return;
}

Assistant:

void Sudoku::skryjNa30()
{
  Sudoku temp(-1); // vytvorime prazdne sudoku
  int x,y;
  do
  {
    temp.initPole(); // uplne vyprazdnime docasne sudoku
    // hledame 30 poli
    for (int n=0; n<30; n++)
    {
      int i;
      do
      {
        i = rand() % 81;
      } while (temp.s.pole[i].zapsane); // najdeme v docasnem sudoku nahodne prazdne policko
      // preneseme z naseho sudoku cislo do docasneho
      temp.s.pole[i].zapsane = s.pole[i].zapsane;
      temp.s.pole[i].pevne = true;// generujeme, vse pevne
      x = i % 9;
      y = i / 9;
      // zakazeme pouzit v radcich/sloupcich/ctvercich vyplnene pole
      temp.s.radky[y] |= (1 << s.pole[i].zapsane);
      temp.s.sloupce[x] |= (1 << s.pole[i].zapsane);
      temp.s.ctverce[x/3][y/3] |= (1 << s.pole[i].zapsane);
    }
    temp.s.doplnenych = 30; // vyplnili jsme 30 policek
  } while (!temp.jednoducheReseni()); // dokud se neda sudoku vyresit jednoduchym doplnovanim
  s = temp.s;// preneseni stavu z docasneho sudoku
}